

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O3

int Abc_GenSignedBoothPP(Gia_Man_t *p,int a,int b,int c,int d,int e)

{
  int iVar1;
  uint iLit1;
  uint uVar2;
  int iLit0;
  
  iVar1 = Gia_ManHashXor(p,d,e);
  iLit1 = Gia_ManHashXor(p,c,d);
  if (-1 < (int)iLit1) {
    uVar2 = Gia_ManHashAnd(p,a,iLit1 ^ 1);
    iLit0 = Gia_ManHashAnd(p,b,iLit1);
    if (-1 < (int)uVar2) {
      iVar1 = Gia_ManHashAnd(p,iVar1,uVar2 ^ 1);
      iVar1 = Gia_ManHashXor(p,iLit0,iVar1);
      iVar1 = Gia_ManHashXor(p,d,iVar1);
      return iVar1;
    }
  }
  __assert_fail("Lit >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                ,0x131,"int Abc_LitNot(int)");
}

Assistant:

int Abc_GenSignedBoothPP( Gia_Man_t * p, int a, int b, int c, int d, int e )
{
/*
    abc>  lutexact -I 5 -N 7 -g F335ACC0

    05 = 4'b0110( d e )
    06 = 4'b0110( c d )
    07 = 4'b0100( a 06 )
    08 = 4'b1000( b 06 )
    09 = 4'b0100( 05 07 )
    10 = 4'b0110( 08 09 )
    11 = 4'b0110( d 10 )
*/
    int n05 = Gia_ManHashXor( p, d,   e   );
    int n06 = Gia_ManHashXor( p, c,   d   );
    int n07 = Gia_ManHashAnd( p, a,   Abc_LitNot(n06) );
    int n08 = Gia_ManHashAnd( p, b,   n06 );
    int n09 = Gia_ManHashAnd( p, n05, Abc_LitNot(n07) );
    int n10 = Gia_ManHashXor( p, n08, n09 );
    int n11 = Gia_ManHashXor( p, d,   n10 );
    return n11;
}